

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::ClipControlFaceCulling::iterate(ClipControlFaceCulling *this)

{
  long *plVar1;
  int *piVar2;
  TestLog *log;
  RenderContext *renderCtx;
  TestContext *this_00;
  bool bVar3;
  int iVar4;
  deUint32 err;
  qpTestResult qVar5;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  long *plVar7;
  char *description;
  TestError *this_02;
  qpTestResult result;
  undefined8 *puVar8;
  ProgramSources *pPVar9;
  bool bVar10;
  long lVar11;
  byte bVar12;
  SharedPtr<glu::ShaderProgram> program;
  ClipControlApi cc;
  float vertex_data0 [24];
  value_type local_158;
  value_type local_138;
  ClipControlApi local_118;
  ProgramSources local_108;
  long lVar6;
  
  bVar12 = 0;
  log = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
         super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  ClipControlApi::ClipControlApi
            (&local_118,
             (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
             m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar6 + 0x5e0))(0xb44);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              m_context)->m_renderCtx;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "#version 400\nin vec3 Position;\nvoid main() {\n    gl_Position = vec4(Position, 1.0);\n}"
             ,"");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,
             "#version 400\nout vec4 FragColor;\nvoid main() {\n    FragColor = vec4(0.0, 1.0, 0.0, 1.0);\n}"
             ,"");
  memset(&local_108,0,0xac);
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_108._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources + 1,&local_138);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,&local_108);
  plVar7 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar7 + 1) = 0;
  *(undefined4 *)((long)plVar7 + 0xc) = 0;
  *plVar7 = (long)&PTR__SharedPtrState_020ebea0;
  plVar7[2] = (long)this_01;
  *(undefined4 *)(plVar7 + 1) = 1;
  *(undefined4 *)((long)plVar7 + 0xc) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_108.attribLocationBindings);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_108.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(log,this_01);
  if ((this_01->m_program).m_info.linkOk != false) {
    (**(code **)(lVar6 + 0x708))(1,&this->m_vao);
    (**(code **)(lVar6 + 0xd8))(this->m_vao);
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_vbo);
    puVar8 = &DAT_01aad800;
    pPVar9 = &local_108;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      pPVar9->sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      pPVar9 = (ProgramSources *)((long)pPVar9 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_vbo);
    (**(code **)(lVar6 + 0x150))(0x8892,0x60,&local_108,0x88e4);
    (**(code **)(lVar6 + 0x19f0))(0,2,0x1406,0,0,0);
    (**(code **)(lVar6 + 0x610))(0);
    (**(code **)(lVar6 + 0x1680))((this_01->m_program).m_program);
    lVar11 = 0;
    result = QP_TEST_RESULT_PASS;
    bVar3 = true;
    do {
      bVar10 = bVar3;
      (**(code **)(lVar6 + 0x1c0))(0x3f800000,0,0,0x3f800000);
      (**(code **)(lVar6 + 0x188))(0x4000);
      (**(code **)(lVar6 + 0x538))(4,0,0xc);
      (*local_118.clipControl)((&DAT_01aad188)[lVar11],0x935e);
      err = (**(code **)(lVar6 + 0x800))();
      glu::checkError(err,"ClipControl()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                      ,0x416);
      qVar5 = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                       super_ClipControlBaseTest.super_TestCase.m_context);
      if (qVar5 != QP_TEST_RESULT_PASS) {
        result = qVar5;
      }
      lVar11 = 1;
      bVar3 = false;
    } while (bVar10);
    this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx;
    description = qpGetTestResultName(result);
    tcu::TestContext::setTestResult(this_00,result,description);
    if (plVar7 != (long *)0x0) {
      LOCK();
      plVar1 = plVar7 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
      }
      LOCK();
      piVar2 = (int *)((long)plVar7 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 8))();
      }
    }
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0x3f1);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{

		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		//Enable GL_CULL_FACE, leave default front face & cull face(CCW, BACK)
		gl.enable(GL_CULL_FACE);

		//Render a counter-clockwise triangles covering
		//(-1.0, -1.0) to(0.0, 1.0) and write a pixel value of green(0, 1, 0).
		//Render a clockwise triangles covering
		//(0.0, -1.0) to(1.0, 1.0) and write a pixel value of green(0, 1, 0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			//CCW
			-1.0, -1.0, 0.0, -1.0, -1.0, 1.0, 0.0, -1.0, 0.0, 1.0, -1.0, 1.0,
			//CW
			0.0, -1.0, 0.0, 1.0, 1.0, -1.0, 1.0, -1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		glw::GLenum origins[] = { GL_UPPER_LEFT, GL_LOWER_LEFT };

		qpTestResult result = QP_TEST_RESULT_PASS;

		for (size_t orig = 0; orig < DE_LENGTH_OF_ARRAY(origins); orig++)
		{
			//Clear the framebuffer to red (1,0,0).
			gl.clearColor(1.0, 0.0, 0.0, 1.0);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.drawArrays(GL_TRIANGLES, 0, 12);

			//Set ClipControl(<origin>, NEGATIVE_ONE_TO_ONE)
			cc.clipControl(origins[orig], GL_NEGATIVE_ONE_TO_ONE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

			//Read back the framebuffer with ReadPixels
			//Verify the green pixels at the left and red at the right.
			qpTestResult loopResult = ValidateFramebuffer(m_context);
			if (loopResult != QP_TEST_RESULT_PASS)
			{
				result = loopResult;
			}
		}
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}